

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O2

int thread_pool_init(thread_pool_t *pool,size_t num_threads)

{
  pthread_attr_t *__attr;
  sem_t *__sem;
  sem_t *__sem_00;
  int iVar1;
  int iVar2;
  Queue *q;
  pthread_t *ppVar3;
  size_t sVar4;
  
  if (pool == (thread_pool_t *)0x0) {
    iVar2 = -3;
  }
  else {
    pool->end = false;
    pool->size = 0;
    __attr = &pool->attr;
    iVar1 = pthread_attr_init((pthread_attr_t *)__attr);
    iVar2 = -1;
    if (-1 < iVar1) {
      __sem = &pool->runnables_semaphore;
      iVar2 = sem_init((sem_t *)__sem,0,0);
      if (iVar2 == 0) {
        __sem_00 = &pool->pool_mutex;
        iVar2 = sem_init((sem_t *)__sem_00,0,1);
        if (iVar2 == 0) {
          q = (Queue *)malloc(0x18);
          pool->runnables = q;
          if (q == (Queue *)0x0) {
            pthread_attr_destroy((pthread_attr_t *)__attr);
            sem_destroy((sem_t *)__sem);
            sem_destroy((sem_t *)__sem_00);
          }
          else {
            queueInit(q);
            ppVar3 = (pthread_t *)malloc(num_threads * 8);
            pool->threads = ppVar3;
            if (ppVar3 != (pthread_t *)0x0) {
              sVar4 = pool->size;
              while( true ) {
                if (sVar4 == num_threads) {
                  return 0;
                }
                iVar2 = pthread_create(pool->threads + sVar4,(pthread_attr_t *)__attr,
                                       thread_pool_thread,pool);
                if (iVar2 != 0) break;
                sVar4 = pool->size + 1;
                pool->size = sVar4;
              }
              thread_pool_destroy(pool);
              return -1;
            }
            pthread_attr_destroy((pthread_attr_t *)__attr);
            sem_destroy((sem_t *)__sem);
            sem_destroy((sem_t *)__sem_00);
            free(pool->runnables);
          }
          return -2;
        }
        pthread_attr_destroy((pthread_attr_t *)__attr);
        sem_destroy((sem_t *)__sem);
      }
      else {
        pthread_attr_destroy((pthread_attr_t *)__attr);
      }
      iVar2 = -4;
    }
  }
  return iVar2;
}

Assistant:

int thread_pool_init(thread_pool_t *pool, size_t num_threads) {
    /* Checks if the pointer is valid. */
    if (!pool) {
        return invalid_argument_error;
    }

    /* Initializes the pool. */
    pool->end = false;
    pool->size = 0;

    /* Inits the attr. */
    if((pthread_attr_init(&(pool->attr))) < 0) {
        return pthread_error;
    }

    /* Initializes semaphores. */
    if((sem_init(&(pool->runnables_semaphore), THREAD_SEMAPHORE, 0))) {
        pthread_attr_destroy(&(pool->attr));
        return semaphore_error;
    }
    if((sem_init(&(pool->pool_mutex), THREAD_SEMAPHORE, 1))) {
        pthread_attr_destroy(&(pool->attr));
        sem_destroy(&(pool->runnables_semaphore));
        return semaphore_error;
    }

    /* Allocates memory and initializes the Queue. */
    if(!(pool->runnables = malloc(sizeof(Queue)))) {
        pthread_attr_destroy(&(pool->attr));
        sem_destroy(&(pool->runnables_semaphore));
        sem_destroy(&(pool->pool_mutex));
        return memory_error;
    }
    queueInit(pool->runnables);

    /* Allocates memory and start worker threads. */
    if(!(pool->threads = malloc(sizeof(pthread_t) * num_threads))) {
        pthread_attr_destroy(&(pool->attr));
        sem_destroy(&(pool->runnables_semaphore));
        sem_destroy(&(pool->pool_mutex));
        free(pool->runnables);
        return memory_error;
    }
    while(pool->size != num_threads) {
        if(pthread_create(&(pool->threads[pool->size]), &(pool->attr), thread_pool_thread, (void*)pool)) {
            thread_pool_destroy(pool);
            return pthread_error;
        }
        pool->size++;
    }

    return success;
}